

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void help(void)

{
  fwrite("usage: processno totalprocesses\n-h help\n-n no shuffled events\n-r use Fisher-Yates shuffle\n-R use std::shuffle\n-v version\n-t text mode\n"
         ,0x86,1,_stderr);
  return;
}

Assistant:

void help() {
    fprintf(stderr, "usage: processno totalprocesses\n"
                    "-h help\n"
                    "-n no shuffled events\n"
		    "-r use Fisher-Yates shuffle\n"
		    "-R use std::shuffle\n"
                    "-v version\n"
                    "-t text mode\n");
}